

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
* llvm::DWARFYAML::EmitDebugSections
            (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
             *__return_storage_ptr__,Data *DI,bool ApplyFixups)

{
  undefined7 in_register_00000011;
  StringRef Sec;
  StringRef Sec_00;
  StringRef Sec_01;
  StringRef Sec_02;
  StringRef Sec_03;
  StringRef Sec_04;
  StringRef Sec_05;
  undefined1 auStack_38 [8];
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  DebugSections;
  
  if ((int)CONCAT71(in_register_00000011,ApplyFixups) != 0) {
    auStack_38 = (undefined1  [8])&PTR_onStartCompileUnit_01128580;
    DebugSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)DI;
    VisitorImpl<llvm::DWARFYAML::Data>::traverseDebugInfo
              ((VisitorImpl<llvm::DWARFYAML::Data> *)auStack_38);
  }
  auStack_38 = (undefined1  [8])0x0;
  DebugSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  DebugSections.super_StringMapImpl.NumBuckets = 0;
  DebugSections.super_StringMapImpl.NumItems = 0x10;
  Sec.Length = 10;
  Sec.Data = "debug_info";
  EmitDebugSectionImpl
            (DI,EmitDebugInfo,Sec,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)auStack_38);
  Sec_00.Length = 10;
  Sec_00.Data = "debug_line";
  EmitDebugSectionImpl
            (DI,EmitDebugLine,Sec_00,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)auStack_38);
  Sec_01.Length = 9;
  Sec_01.Data = "debug_str";
  EmitDebugSectionImpl
            (DI,EmitDebugStr,Sec_01,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)auStack_38);
  Sec_02.Length = 0xc;
  Sec_02.Data = "debug_abbrev";
  EmitDebugSectionImpl
            (DI,EmitDebugAbbrev,Sec_02,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)auStack_38);
  Sec_03.Length = 0xd;
  Sec_03.Data = "debug_aranges";
  EmitDebugSectionImpl
            (DI,EmitDebugAranges,Sec_03,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)auStack_38);
  Sec_04.Length = 0xc;
  Sec_04.Data = "debug_ranges";
  EmitDebugSectionImpl
            (DI,EmitDebugRanges,Sec_04,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)auStack_38);
  Sec_05.Length = 9;
  Sec_05.Data = "debug_loc";
  EmitDebugSectionImpl
            (DI,EmitDebugLoc,Sec_05,
             (StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
              *)auStack_38);
  (__return_storage_ptr__->super_StringMapImpl).TheTable = (StringMapEntryBase **)auStack_38;
  *(StringMapEntryBase ***)&(__return_storage_ptr__->super_StringMapImpl).NumBuckets =
       DebugSections.super_StringMapImpl.TheTable;
  (__return_storage_ptr__->super_StringMapImpl).NumTombstones =
       DebugSections.super_StringMapImpl.NumBuckets;
  (__return_storage_ptr__->super_StringMapImpl).ItemSize =
       DebugSections.super_StringMapImpl.NumItems;
  auStack_38 = (undefined1  [8])0x0;
  DebugSections.super_StringMapImpl.TheTable = (StringMapEntryBase **)0x0;
  DebugSections.super_StringMapImpl._8_8_ =
       DebugSections.super_StringMapImpl._8_8_ & 0xffffffff00000000;
  StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
  ::~StringMap((StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                *)auStack_38);
  return __return_storage_ptr__;
}

Assistant:

StringMap<std::unique_ptr<MemoryBuffer>>
EmitDebugSections(llvm::DWARFYAML::Data &DI, bool ApplyFixups) {
  if (ApplyFixups) {
    DIEFixupVisitor DIFixer(DI);
    DIFixer.traverseDebugInfo();
  }

  StringMap<std::unique_ptr<MemoryBuffer>> DebugSections;
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugInfo, "debug_info",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugLine, "debug_line",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugStr, "debug_str",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugAbbrev, "debug_abbrev",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugAranges, "debug_aranges",
                       DebugSections);
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugRanges, "debug_ranges",
                       DebugSections); // XXX BINARYEN
  EmitDebugSectionImpl(DI, &DWARFYAML::EmitDebugLoc, "debug_loc",
                       DebugSections); // XXX BINARYEN
  return std::move(DebugSections);
}